

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BufferLimitedLabelCase::iterate
          (BufferLimitedLabelCase *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  size_t sVar7;
  Enum<int,_2UL> EVar8;
  MessageBuilder local_3768;
  allocator<char> local_35e1;
  string local_35e0;
  allocator<char> local_35b9;
  string local_35b8;
  string local_3598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3578;
  GetNameFunc local_3558;
  int local_3550;
  GetNameFunc local_3548;
  int local_3540;
  string local_3538;
  allocator<char> local_3511;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_34f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_34d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_34b0;
  int local_348c;
  undefined1 local_3488 [4];
  deUint32 err_11;
  allocator<char> local_3301;
  string local_3300;
  allocator<char> local_32d9;
  string local_32d8;
  ScopedLogSection local_32b8;
  ScopedLogSection section_7;
  allocator<char> local_3129;
  string local_3128;
  MessageBuilder local_3108;
  allocator<char> local_2f81;
  string local_2f80;
  allocator<char> local_2f59;
  string local_2f58;
  string local_2f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f18;
  GetNameFunc local_2ef8;
  int local_2ef0;
  GetNameFunc local_2ee8;
  int local_2ee0;
  string local_2ed8;
  allocator<char> local_2eb1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e50;
  int local_2e2c;
  undefined1 local_2e28 [4];
  deUint32 err_10;
  allocator<char> local_2ca1;
  string local_2ca0;
  allocator<char> local_2c79;
  string local_2c78;
  ScopedLogSection local_2c58;
  ScopedLogSection section_6;
  allocator<char> local_2ac9;
  string local_2ac8;
  MessageBuilder local_2aa8;
  allocator<char> local_2921;
  string local_2920;
  allocator<char> local_28f9;
  string local_28f8;
  allocator<char> local_28d1;
  string local_28d0;
  GetNameFunc local_28b0;
  int local_28a8;
  GetNameFunc local_28a0;
  int local_2898;
  string local_2890;
  allocator<char> local_2869;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2808;
  int local_27e4;
  undefined1 local_27e0 [4];
  deUint32 err_9;
  allocator<char> local_2659;
  string local_2658;
  allocator<char> local_2631;
  string local_2630;
  ScopedLogSection local_2610;
  ScopedLogSection section_5;
  allocator<char> local_2481;
  string local_2480;
  MessageBuilder local_2460;
  allocator<char> local_22d9;
  string local_22d8;
  allocator<char> local_22b1;
  string local_22b0;
  string local_2290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2270;
  GetNameFunc local_2250;
  int local_2248;
  GetNameFunc local_2240;
  int local_2238;
  string local_2230;
  allocator<char> local_2209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21a8;
  int local_2184;
  undefined1 local_2180 [4];
  deUint32 err_8;
  allocator<char> local_1ff9;
  string local_1ff8;
  allocator<char> local_1fd1;
  string local_1fd0;
  ScopedLogSection local_1fb0;
  ScopedLogSection section_4;
  TestLog *local_1f98;
  int local_1f90;
  string local_1f88;
  allocator<char> local_1f61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f00;
  int local_1edc;
  undefined1 local_1ed8 [4];
  deUint32 err_7;
  allocator<char> local_1d51;
  string local_1d50;
  allocator<char> local_1d29;
  string local_1d28;
  ScopedLogSection local_1d08;
  ScopedLogSection superSection_1;
  allocator<char> local_1b79;
  string local_1b78;
  allocator<char> local_1b51;
  string local_1b50;
  string local_1b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b10;
  GetNameFunc local_1af0;
  int local_1ae8;
  GetNameFunc local_1ae0;
  int local_1ad8;
  string local_1ad0;
  allocator<char> local_1aa9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a48;
  int local_1a24;
  undefined1 local_1a20 [4];
  deUint32 err_6;
  allocator<char> local_1899;
  string local_1898;
  allocator<char> local_1871;
  string local_1870;
  ScopedLogSection local_1850;
  ScopedLogSection section_3;
  allocator<char> local_16c1;
  string local_16c0;
  MessageBuilder local_16a0;
  allocator<char> local_1519;
  string local_1518;
  allocator<char> local_14f1;
  string local_14f0;
  string local_14d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b0;
  GetNameFunc local_1490;
  int local_1488;
  GetNameFunc local_1480;
  int local_1478;
  string local_1470;
  allocator<char> local_1449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e8;
  int local_13c4;
  undefined1 local_13c0 [4];
  deUint32 err_5;
  allocator<char> local_1239;
  string local_1238;
  allocator<char> local_1211;
  string local_1210;
  ScopedLogSection local_11f0;
  ScopedLogSection section_2;
  allocator<char> local_1061;
  string local_1060;
  MessageBuilder local_1040;
  allocator<char> local_eb9;
  string local_eb8;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  GetNameFunc local_e48;
  int local_e40;
  GetNameFunc local_e38;
  int local_e30;
  string local_e28;
  allocator<char> local_e01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  int local_d7c;
  undefined1 local_d78 [4];
  deUint32 err_4;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  ScopedLogSection local_ba8;
  ScopedLogSection section_1;
  allocator<char> local_a19;
  string local_a18;
  MessageBuilder local_9f8;
  allocator<char> local_871;
  string local_870;
  allocator<char> local_849;
  string local_848;
  string local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  GetNameFunc local_7e8;
  int local_7e0;
  GetNameFunc local_7d8;
  int local_7d0;
  string local_7c8;
  allocator<char> local_7a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  int local_71c;
  undefined1 local_718 [4];
  deUint32 err_3;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  ScopedLogSection local_548;
  ScopedLogSection section;
  TestLog *local_530;
  int local_528;
  string local_520;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  int local_474;
  undefined1 local_470 [4];
  deUint32 err_2;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  ScopedLogSection local_2a0;
  ScopedLogSection superSection;
  TestLog *local_288;
  int local_280;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  int local_1cc;
  GetNameFunc p_Stack_1c8;
  deUint32 err_1;
  int local_1c0;
  GetNameFunc local_1b8;
  int local_1b0;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  int local_fc;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  deUint32 err;
  char buffer [64];
  GLsync sync;
  GLuint shader;
  int outlen;
  char *msg;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  Functions *gl;
  BufferLimitedLabelCase *this_local;
  
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = isKHRDebugSupported((this->super_TestCase).m_context), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      result.m_message.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98," // ERROR: ",(allocator<char> *)((long)&msg + 7));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar5,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&msg + 7));
      _shader = "This is a debug label";
      sync._4_4_ = -1;
      buffer._56_8_ = (**(code **)(result.m_message.field_2._8_8_ + 0x640))(0x9117,0);
      do {
        local_fc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_fc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"Got Error ",&local_181);
          EVar8 = glu::getErrorStr(local_fc);
          p_Stack_1c8 = EVar8.m_getName;
          local_1c0 = EVar8.m_value;
          local_1b8 = p_Stack_1c8;
          local_1b0 = local_1c0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a8,&local_1b8);
          std::operator+(&local_160,&local_180,&local_1a8);
          std::operator+(&local_140,&local_160,": ");
          std::operator+(&local_120,&local_140,"fenceSync");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator(&local_181);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      sync._0_4_ = (**(code **)(result.m_message.field_2._8_8_ + 0x3f0))(0x8b30);
      do {
        local_1cc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1cc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"Got Error ",&local_251);
          EVar8 = glu::getErrorStr(local_1cc);
          superSection.m_log = (TestLog *)EVar8.m_getName;
          local_280 = EVar8.m_value;
          local_288 = superSection.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_278,&local_288);
          std::operator+(&local_230,&local_250,&local_278);
          std::operator+(&local_210,&local_230,": ");
          std::operator+(&local_1f0,&local_210,"createShader");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator(&local_251);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Shader",&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"Shader object",&local_2e9);
      tcu::ScopedLogSection::ScopedLogSection(&local_2a0,pTVar5,&local_2c0,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_470,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_470,(char (*) [27])"Setting label to string: \"");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&shader);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_470);
      (**(code **)(result.m_message.field_2._8_8_ + 0xfc0))
                (0x82e1,sync._0_4_,0xffffffff,"This is a debug label");
      do {
        local_474 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_474 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f8,"Got Error ",&local_4f9);
          EVar8 = glu::getErrorStr(local_474);
          section.m_log = (TestLog *)EVar8.m_getName;
          local_528 = EVar8.m_value;
          local_530 = section.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_520,&local_530);
          std::operator+(&local_4d8,&local_4f8,&local_520);
          std::operator+(&local_4b8,&local_4d8,": ");
          std::operator+(&local_498,&local_4b8,"objectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator(&local_4f9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"QueryAll",&local_569)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_590,"Query All",&local_591);
      tcu::ScopedLogSection::ScopedLogSection(&local_548,pTVar5,&local_568,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator(&local_591);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_718,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_718,
                          (char (*) [39])"Querying whole label, buffer size = 22");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_718);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))
                (0x82e1,sync._0_4_,0x16,(long)&sync + 4,&local_f8);
      do {
        local_71c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_71c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7a0,"Got Error ",&local_7a1);
          EVar8 = glu::getErrorStr(local_71c);
          local_7e8 = EVar8.m_getName;
          local_7e0 = EVar8.m_value;
          local_7d8 = local_7e8;
          local_7d0 = local_7e0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_7c8,&local_7d8);
          std::operator+(&local_780,&local_7a0,&local_7c8);
          std::operator+(&local_760,&local_780,": ");
          std::operator+(&local_740,&local_760,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_740);
          std::__cxx11::string::~string((string *)&local_740);
          std::__cxx11::string::~string((string *)&local_760);
          std::__cxx11::string::~string((string *)&local_780);
          std::__cxx11::string::~string((string *)&local_7c8);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::allocator<char>::~allocator(&local_7a1);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0x15) {
        if (buffer[0xd] == '\0') {
          if (buffer[0xe] == 'X') {
            dVar2 = deStringEqual("This is a debug label",&local_f8);
            if (dVar2 == 0) {
              buffer[0x37] = '\0';
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_9f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_9f8,(char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_9f8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a18,"Query returned wrong label",&local_a19);
              tcu::ResultCollector::fail((ResultCollector *)local_78,&local_a18);
              std::__cxx11::string::~string((string *)&local_a18);
              std::allocator<char>::~allocator(&local_a19);
            }
            else {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&section_1,pTVar5,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&section_1,
                                  (char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_870,"Query wrote over buffer bound",&local_871);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_870);
            std::__cxx11::string::~string((string *)&local_870);
            std::allocator<char>::~allocator(&local_871);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_848,"Buffer was not null-terminated",&local_849);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_848);
          std::__cxx11::string::~string((string *)&local_848);
          std::allocator<char>::~allocator(&local_849);
        }
      }
      else {
        de::toString<int>(&local_828,(int *)((long)&sync + 4));
        std::operator+(&local_808,"\'length\' was not 21, got ",&local_828);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_808);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&local_828);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_548);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bc8,"QueryAllNoSize",&local_bc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf0,"Query all without size",&local_bf1);
      tcu::ScopedLogSection::ScopedLogSection(&local_ba8,pTVar5,&local_bc8,&local_bf0);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::allocator<char>::~allocator(&local_bf1);
      std::__cxx11::string::~string((string *)&local_bc8);
      std::allocator<char>::~allocator(&local_bc9);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_d78,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_d78,
                          (char (*) [39])"Querying whole label, buffer size = 22");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d78);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))(0x82e1,sync._0_4_,0x16,0,&local_f8);
      do {
        local_d7c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_d7c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e00,"Got Error ",&local_e01);
          EVar8 = glu::getErrorStr(local_d7c);
          local_e48 = EVar8.m_getName;
          local_e40 = EVar8.m_value;
          local_e38 = local_e48;
          local_e30 = local_e40;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e28,&local_e38);
          std::operator+(&local_de0,&local_e00,&local_e28);
          std::operator+(&local_dc0,&local_de0,": ");
          std::operator+(&local_da0,&local_dc0,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_da0);
          std::__cxx11::string::~string((string *)&local_da0);
          std::__cxx11::string::~string((string *)&local_dc0);
          std::__cxx11::string::~string((string *)&local_de0);
          std::__cxx11::string::~string((string *)&local_e28);
          std::__cxx11::string::~string((string *)&local_e00);
          std::allocator<char>::~allocator(&local_e01);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      buffer[0x37] = '\0';
      sVar7 = strlen(&local_f8);
      if (sVar7 == 0x15) {
        if (buffer[0xd] == '\0') {
          if (buffer[0xe] == 'X') {
            dVar2 = deStringEqual("This is a debug label",&local_f8);
            if (dVar2 == 0) {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_1040,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_1040,(char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1040);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1060,"Query returned wrong label",&local_1061);
              tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1060);
              std::__cxx11::string::~string((string *)&local_1060);
              std::allocator<char>::~allocator(&local_1061);
            }
            else {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&section_2,pTVar5,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&section_2,
                                  (char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_2);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_eb8,"Query wrote over buffer bound",&local_eb9);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_eb8);
            std::__cxx11::string::~string((string *)&local_eb8);
            std::allocator<char>::~allocator(&local_eb9);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e90,"Buffer was not null-terminated",&local_e91);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_e90);
          std::__cxx11::string::~string((string *)&local_e90);
          std::allocator<char>::~allocator(&local_e91);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e68,"Buffer length was not 21",&local_e69);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_e68);
        std::__cxx11::string::~string((string *)&local_e68);
        std::allocator<char>::~allocator(&local_e69);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_ba8);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1210,"QueryLess",&local_1211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1238,"Query substring",&local_1239);
      tcu::ScopedLogSection::ScopedLogSection(&local_11f0,pTVar5,&local_1210,&local_1238);
      std::__cxx11::string::~string((string *)&local_1238);
      std::allocator<char>::~allocator(&local_1239);
      std::__cxx11::string::~string((string *)&local_1210);
      std::allocator<char>::~allocator(&local_1211);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_13c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_13c0,
                          (char (*) [38])"Querying whole label, buffer size = 2");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_13c0);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))
                (0x82e1,sync._0_4_,2,(long)&sync + 4,&local_f8);
      do {
        local_13c4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_13c4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1448,"Got Error ",&local_1449);
          EVar8 = glu::getErrorStr(local_13c4);
          local_1490 = EVar8.m_getName;
          local_1488 = EVar8.m_value;
          local_1480 = local_1490;
          local_1478 = local_1488;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1470,&local_1480);
          std::operator+(&local_1428,&local_1448,&local_1470);
          std::operator+(&local_1408,&local_1428,": ");
          std::operator+(&local_13e8,&local_1408,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_13e8);
          std::__cxx11::string::~string((string *)&local_13e8);
          std::__cxx11::string::~string((string *)&local_1408);
          std::__cxx11::string::~string((string *)&local_1428);
          std::__cxx11::string::~string((string *)&local_1470);
          std::__cxx11::string::~string((string *)&local_1448);
          std::allocator<char>::~allocator(&local_1449);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 1) {
        if (cStack_f7 == '\0') {
          if (cStack_f6 == 'X') {
            dVar2 = deStringBeginsWith("This is a debug label",&local_f8);
            if (dVar2 == 0) {
              buffer[0x37] = '\0';
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_16a0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_16a0,(char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_16a0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_16c0,"Query returned wrong label",&local_16c1);
              tcu::ResultCollector::fail((ResultCollector *)local_78,&local_16c0);
              std::__cxx11::string::~string((string *)&local_16c0);
              std::allocator<char>::~allocator(&local_16c1);
            }
            else {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&section_3,pTVar5,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&section_3,
                                  (char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_3);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1518,"Query wrote over buffer bound",&local_1519);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1518);
            std::__cxx11::string::~string((string *)&local_1518);
            std::allocator<char>::~allocator(&local_1519);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_14f0,"Buffer was not null-terminated",&local_14f1);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_14f0);
          std::__cxx11::string::~string((string *)&local_14f0);
          std::allocator<char>::~allocator(&local_14f1);
        }
      }
      else {
        de::toString<int>(&local_14d0,(int *)((long)&sync + 4));
        std::operator+(&local_14b0,"\'length\' was not 1, got ",&local_14d0);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_14b0);
        std::__cxx11::string::~string((string *)&local_14b0);
        std::__cxx11::string::~string((string *)&local_14d0);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_11f0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1870,"QueryNone",&local_1871);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1898,"Query one character",&local_1899);
      tcu::ScopedLogSection::ScopedLogSection(&local_1850,pTVar5,&local_1870,&local_1898);
      std::__cxx11::string::~string((string *)&local_1898);
      std::allocator<char>::~allocator(&local_1899);
      std::__cxx11::string::~string((string *)&local_1870);
      std::allocator<char>::~allocator(&local_1871);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1a20,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a20,
                          (char (*) [38])"Querying whole label, buffer size = 1");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a20);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))
                (0x82e1,sync._0_4_,1,(long)&sync + 4,&local_f8);
      do {
        local_1a24 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1a24 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1aa8,"Got Error ",&local_1aa9);
          EVar8 = glu::getErrorStr(local_1a24);
          local_1af0 = EVar8.m_getName;
          local_1ae8 = EVar8.m_value;
          local_1ae0 = local_1af0;
          local_1ad8 = local_1ae8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1ad0,&local_1ae0);
          std::operator+(&local_1a88,&local_1aa8,&local_1ad0);
          std::operator+(&local_1a68,&local_1a88,": ");
          std::operator+(&local_1a48,&local_1a68,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1a48);
          std::__cxx11::string::~string((string *)&local_1a48);
          std::__cxx11::string::~string((string *)&local_1a68);
          std::__cxx11::string::~string((string *)&local_1a88);
          std::__cxx11::string::~string((string *)&local_1ad0);
          std::__cxx11::string::~string((string *)&local_1aa8);
          std::allocator<char>::~allocator(&local_1aa9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0) {
        if (local_f8 == '\0') {
          if (cStack_f7 == 'X') {
            pTVar5 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&superSection_1,pTVar5,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&superSection_1,
                                (char (*) [49])"Query returned zero-sized null-terminated string");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&superSection_1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b78,"Query wrote over buffer bound",&local_1b79);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1b78);
            std::__cxx11::string::~string((string *)&local_1b78);
            std::allocator<char>::~allocator(&local_1b79);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b50,"Buffer was not null-terminated",&local_1b51);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1b50);
          std::__cxx11::string::~string((string *)&local_1b50);
          std::allocator<char>::~allocator(&local_1b51);
        }
      }
      else {
        de::toString<int>(&local_1b30,(int *)((long)&sync + 4));
        std::operator+(&local_1b10,"\'length\' was not 0, got ",&local_1b30);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1b10);
        std::__cxx11::string::~string((string *)&local_1b10);
        std::__cxx11::string::~string((string *)&local_1b30);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_1850);
      tcu::ScopedLogSection::~ScopedLogSection(&local_2a0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d28,"Sync",&local_1d29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d50,"Sync object",&local_1d51);
      tcu::ScopedLogSection::ScopedLogSection(&local_1d08,pTVar5,&local_1d28,&local_1d50);
      std::__cxx11::string::~string((string *)&local_1d50);
      std::allocator<char>::~allocator(&local_1d51);
      std::__cxx11::string::~string((string *)&local_1d28);
      std::allocator<char>::~allocator(&local_1d29);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1ed8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1ed8,(char (*) [27])"Setting label to string: \"")
      ;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&shader);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1ed8);
      (**(code **)(result.m_message.field_2._8_8_ + 0xfc8))
                (buffer._56_8_,0xffffffff,"This is a debug label");
      do {
        local_1edc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1edc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f60,"Got Error ",&local_1f61);
          EVar8 = glu::getErrorStr(local_1edc);
          section_4.m_log = (TestLog *)EVar8.m_getName;
          local_1f90 = EVar8.m_value;
          local_1f98 = section_4.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f88,&local_1f98);
          std::operator+(&local_1f40,&local_1f60,&local_1f88);
          std::operator+(&local_1f20,&local_1f40,": ");
          std::operator+(&local_1f00,&local_1f20,"objectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1f00);
          std::__cxx11::string::~string((string *)&local_1f00);
          std::__cxx11::string::~string((string *)&local_1f20);
          std::__cxx11::string::~string((string *)&local_1f40);
          std::__cxx11::string::~string((string *)&local_1f88);
          std::__cxx11::string::~string((string *)&local_1f60);
          std::allocator<char>::~allocator(&local_1f61);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1fd0,"QueryAll",&local_1fd1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1ff8,"Query All",&local_1ff9);
      tcu::ScopedLogSection::ScopedLogSection(&local_1fb0,pTVar5,&local_1fd0,&local_1ff8);
      std::__cxx11::string::~string((string *)&local_1ff8);
      std::allocator<char>::~allocator(&local_1ff9);
      std::__cxx11::string::~string((string *)&local_1fd0);
      std::allocator<char>::~allocator(&local_1fd1);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_2180,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_2180,
                          (char (*) [39])"Querying whole label, buffer size = 22");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2180);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))
                (buffer._56_8_,0x16,(long)&sync + 4,&local_f8);
      do {
        local_2184 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_2184 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2208,"Got Error ",&local_2209);
          EVar8 = glu::getErrorStr(local_2184);
          local_2250 = EVar8.m_getName;
          local_2248 = EVar8.m_value;
          local_2240 = local_2250;
          local_2238 = local_2248;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2230,&local_2240);
          std::operator+(&local_21e8,&local_2208,&local_2230);
          std::operator+(&local_21c8,&local_21e8,": ");
          std::operator+(&local_21a8,&local_21c8,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_21a8);
          std::__cxx11::string::~string((string *)&local_21a8);
          std::__cxx11::string::~string((string *)&local_21c8);
          std::__cxx11::string::~string((string *)&local_21e8);
          std::__cxx11::string::~string((string *)&local_2230);
          std::__cxx11::string::~string((string *)&local_2208);
          std::allocator<char>::~allocator(&local_2209);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0x15) {
        if (buffer[0xd] == '\0') {
          if (buffer[0xe] == 'X') {
            dVar2 = deStringEqual("This is a debug label",&local_f8);
            if (dVar2 == 0) {
              buffer[0x37] = '\0';
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_2460,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_2460,(char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_2460);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2480,"Query returned wrong label",&local_2481);
              tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2480);
              std::__cxx11::string::~string((string *)&local_2480);
              std::allocator<char>::~allocator(&local_2481);
            }
            else {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&section_5,pTVar5,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&section_5,
                                  (char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_5);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_22d8,"Query wrote over buffer bound",&local_22d9);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_22d8);
            std::__cxx11::string::~string((string *)&local_22d8);
            std::allocator<char>::~allocator(&local_22d9);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_22b0,"Buffer was not null-terminated",&local_22b1);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_22b0);
          std::__cxx11::string::~string((string *)&local_22b0);
          std::allocator<char>::~allocator(&local_22b1);
        }
      }
      else {
        de::toString<int>(&local_2290,(int *)((long)&sync + 4));
        std::operator+(&local_2270,"\'length\' was not 21, got ",&local_2290);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2270);
        std::__cxx11::string::~string((string *)&local_2270);
        std::__cxx11::string::~string((string *)&local_2290);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_1fb0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2630,"QueryAllNoSize",&local_2631);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2658,"Query all without size",&local_2659);
      tcu::ScopedLogSection::ScopedLogSection(&local_2610,pTVar5,&local_2630,&local_2658);
      std::__cxx11::string::~string((string *)&local_2658);
      std::allocator<char>::~allocator(&local_2659);
      std::__cxx11::string::~string((string *)&local_2630);
      std::allocator<char>::~allocator(&local_2631);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_27e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_27e0,
                          (char (*) [39])"Querying whole label, buffer size = 22");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_27e0);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))(buffer._56_8_,0x16,0,&local_f8);
      do {
        local_27e4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_27e4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2868,"Got Error ",&local_2869);
          EVar8 = glu::getErrorStr(local_27e4);
          local_28b0 = EVar8.m_getName;
          local_28a8 = EVar8.m_value;
          local_28a0 = local_28b0;
          local_2898 = local_28a8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2890,&local_28a0);
          std::operator+(&local_2848,&local_2868,&local_2890);
          std::operator+(&local_2828,&local_2848,": ");
          std::operator+(&local_2808,&local_2828,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2808);
          std::__cxx11::string::~string((string *)&local_2808);
          std::__cxx11::string::~string((string *)&local_2828);
          std::__cxx11::string::~string((string *)&local_2848);
          std::__cxx11::string::~string((string *)&local_2890);
          std::__cxx11::string::~string((string *)&local_2868);
          std::allocator<char>::~allocator(&local_2869);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      buffer[0x37] = '\0';
      sVar7 = strlen(&local_f8);
      if (sVar7 == 0x15) {
        if (buffer[0xd] == '\0') {
          if (buffer[0xe] == 'X') {
            dVar2 = deStringEqual("This is a debug label",&local_f8);
            if (dVar2 == 0) {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_2aa8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_2aa8,(char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_2aa8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2ac8,"Query returned wrong label",&local_2ac9);
              tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2ac8);
              std::__cxx11::string::~string((string *)&local_2ac8);
              std::allocator<char>::~allocator(&local_2ac9);
            }
            else {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&section_6,pTVar5,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&section_6,
                                  (char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_6);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2920,"Query wrote over buffer bound",&local_2921);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2920);
            std::__cxx11::string::~string((string *)&local_2920);
            std::allocator<char>::~allocator(&local_2921);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_28f8,"Buffer was not null-terminated",&local_28f9);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_28f8);
          std::__cxx11::string::~string((string *)&local_28f8);
          std::allocator<char>::~allocator(&local_28f9);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_28d0,"Buffer length was not 21",&local_28d1);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_28d0);
        std::__cxx11::string::~string((string *)&local_28d0);
        std::allocator<char>::~allocator(&local_28d1);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_2610);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c78,"QueryLess",&local_2c79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2ca0,"Query substring",&local_2ca1);
      tcu::ScopedLogSection::ScopedLogSection(&local_2c58,pTVar5,&local_2c78,&local_2ca0);
      std::__cxx11::string::~string((string *)&local_2ca0);
      std::allocator<char>::~allocator(&local_2ca1);
      std::__cxx11::string::~string((string *)&local_2c78);
      std::allocator<char>::~allocator(&local_2c79);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_2e28,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_2e28,
                          (char (*) [38])"Querying whole label, buffer size = 2");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2e28);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))
                (buffer._56_8_,2,(long)&sync + 4,&local_f8);
      do {
        local_2e2c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_2e2c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2eb0,"Got Error ",&local_2eb1);
          EVar8 = glu::getErrorStr(local_2e2c);
          local_2ef8 = EVar8.m_getName;
          local_2ef0 = EVar8.m_value;
          local_2ee8 = local_2ef8;
          local_2ee0 = local_2ef0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2ed8,&local_2ee8);
          std::operator+(&local_2e90,&local_2eb0,&local_2ed8);
          std::operator+(&local_2e70,&local_2e90,": ");
          std::operator+(&local_2e50,&local_2e70,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2e50);
          std::__cxx11::string::~string((string *)&local_2e50);
          std::__cxx11::string::~string((string *)&local_2e70);
          std::__cxx11::string::~string((string *)&local_2e90);
          std::__cxx11::string::~string((string *)&local_2ed8);
          std::__cxx11::string::~string((string *)&local_2eb0);
          std::allocator<char>::~allocator(&local_2eb1);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 1) {
        if (cStack_f7 == '\0') {
          if (cStack_f6 == 'X') {
            dVar2 = deStringBeginsWith("This is a debug label",&local_f8);
            if (dVar2 == 0) {
              buffer[0x37] = '\0';
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_3108,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_3108,(char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_3108);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3128,"Query returned wrong label",&local_3129);
              tcu::ResultCollector::fail((ResultCollector *)local_78,&local_3128);
              std::__cxx11::string::~string((string *)&local_3128);
              std::allocator<char>::~allocator(&local_3129);
            }
            else {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&section_7,pTVar5,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&section_7,
                                  (char (*) [25])"Query returned string: \"");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&local_f8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_7);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f80,"Query wrote over buffer bound",&local_2f81);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2f80);
            std::__cxx11::string::~string((string *)&local_2f80);
            std::allocator<char>::~allocator(&local_2f81);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f58,"Buffer was not null-terminated",&local_2f59);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2f58);
          std::__cxx11::string::~string((string *)&local_2f58);
          std::allocator<char>::~allocator(&local_2f59);
        }
      }
      else {
        de::toString<int>(&local_2f38,(int *)((long)&sync + 4));
        std::operator+(&local_2f18,"\'length\' was not 1, got ",&local_2f38);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2f18);
        std::__cxx11::string::~string((string *)&local_2f18);
        std::__cxx11::string::~string((string *)&local_2f38);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_2c58);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_32d8,"QueryNone",&local_32d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3300,"Query one character",&local_3301);
      tcu::ScopedLogSection::ScopedLogSection(&local_32b8,pTVar5,&local_32d8,&local_3300);
      std::__cxx11::string::~string((string *)&local_3300);
      std::allocator<char>::~allocator(&local_3301);
      std::__cxx11::string::~string((string *)&local_32d8);
      std::allocator<char>::~allocator(&local_32d9);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_3488,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_3488,
                          (char (*) [38])"Querying whole label, buffer size = 1");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3488);
      ::deMemset(&local_f8,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))
                (buffer._56_8_,1,(long)&sync + 4,&local_f8);
      do {
        local_348c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_348c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3510,"Got Error ",&local_3511);
          EVar8 = glu::getErrorStr(local_348c);
          local_3558 = EVar8.m_getName;
          local_3550 = EVar8.m_value;
          local_3548 = local_3558;
          local_3540 = local_3550;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3538,&local_3548);
          std::operator+(&local_34f0,&local_3510,&local_3538);
          std::operator+(&local_34d0,&local_34f0,": ");
          std::operator+(&local_34b0,&local_34d0,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_34b0);
          std::__cxx11::string::~string((string *)&local_34b0);
          std::__cxx11::string::~string((string *)&local_34d0);
          std::__cxx11::string::~string((string *)&local_34f0);
          std::__cxx11::string::~string((string *)&local_3538);
          std::__cxx11::string::~string((string *)&local_3510);
          std::allocator<char>::~allocator(&local_3511);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0) {
        if (local_f8 == '\0') {
          if (cStack_f7 == 'X') {
            pTVar5 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_3768,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_3768,
                                (char (*) [49])"Query returned zero-sized null-terminated string");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_3768);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_35e0,"Query wrote over buffer bound",&local_35e1);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_35e0);
            std::__cxx11::string::~string((string *)&local_35e0);
            std::allocator<char>::~allocator(&local_35e1);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_35b8,"Buffer was not null-terminated",&local_35b9);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_35b8);
          std::__cxx11::string::~string((string *)&local_35b8);
          std::allocator<char>::~allocator(&local_35b9);
        }
      }
      else {
        de::toString<int>(&local_3598,(int *)((long)&sync + 4));
        std::operator+(&local_3578,"\'length\' was not 0, got ",&local_3598);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_3578);
        std::__cxx11::string::~string((string *)&local_3578);
        std::__cxx11::string::~string((string *)&local_3598);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_32b8);
      tcu::ScopedLogSection::~ScopedLogSection(&local_1d08);
      (**(code **)(result.m_message.field_2._8_8_ + 0x470))(sync._0_4_);
      (**(code **)(result.m_message.field_2._8_8_ + 0x478))(buffer._56_8_);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_78,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x874);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

BufferLimitedLabelCase::IterateResult BufferLimitedLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection superSection(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAll", "Query All");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 22, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 21)
				result.fail("'length' was not 21, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAllNoSize", "Query all without size");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 22, DE_NULL, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			buffer[63] = '\0'; // make sure buffer is null terminated before strlen

			if (strlen(buffer) != 21)
				result.fail("Buffer length was not 21");
			else if (buffer[21] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[22] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryLess", "Query substring");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 2" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 2, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 1)
				result.fail("'length' was not 1, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringBeginsWith(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryNone", "Query one character");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 1" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 1, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 0)
				result.fail("'length' was not 0, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned zero-sized null-terminated string" << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection superSection(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAll", "Query All");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 22, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 21)
				result.fail("'length' was not 21, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAllNoSize", "Query all without size");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 22, DE_NULL, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			buffer[63] = '\0'; // make sure buffer is null terminated before strlen

			if (strlen(buffer) != 21)
				result.fail("Buffer length was not 21");
			else if (buffer[21] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[22] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryLess", "Query substring");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 2" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 2, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 1)
				result.fail("'length' was not 1, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringBeginsWith(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryNone", "Query one character");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 1" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 1, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 0)
				result.fail("'length' was not 0, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned zero-sized null-terminated string" << TestLog::EndMessage;
		}
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}